

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::NanoVDBMediumProvider,pbrt::Bounds3<float>&,nanovdb::GridHandle<pbrt::NanoVDBBuffer>,nanovdb::GridHandle<pbrt::NanoVDBBuffer>,float&,float&,float&>
          (polymorphic_allocator<std::byte> *this,NanoVDBMediumProvider *p,Bounds3<float> *args,
          GridHandle<pbrt::NanoVDBBuffer> *args_1,GridHandle<pbrt::NanoVDBBuffer> *args_2,
          float *args_3,float *args_4,float *args_5)

{
  NanoVDBMediumProvider *in_RCX;
  GridHandle<pbrt::NanoVDBBuffer> *in_RSI;
  Bounds3f *in_R8;
  GridHandle<pbrt::NanoVDBBuffer> *in_R9;
  GridHandle<pbrt::NanoVDBBuffer> *in_stack_ffffffffffffff58;
  Float in_stack_ffffffffffffffbc;
  Float in_stack_ffffffffffffffc0;
  Float in_stack_ffffffffffffffc4;
  GridHandle<pbrt::NanoVDBBuffer> *in_stack_ffffffffffffffc8;
  
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::GridHandle(in_RSI,in_stack_ffffffffffffff58);
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::GridHandle(in_RSI,in_stack_ffffffffffffff58);
  pbrt::NanoVDBMediumProvider::NanoVDBMediumProvider
            (in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::~GridHandle(in_RSI);
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::~GridHandle(in_RSI);
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }